

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O3

void * __thiscall
BitSetImplement<std::bitset<128UL>,_KDefectiveRDS>::setIntersection
          (BitSetImplement<std::bitset<128UL>,_KDefectiveRDS> *this,void *A,void *B)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  
  puVar7 = (uint *)operator_new(0x10);
  uVar1 = *(uint *)((long)A + 4);
  uVar2 = *(uint *)((long)A + 8);
  uVar3 = *(uint *)((long)A + 0xc);
  uVar4 = *(uint *)((long)B + 4);
  uVar5 = *(uint *)((long)B + 8);
  uVar6 = *(uint *)((long)B + 0xc);
  *puVar7 = *B & *A;
  puVar7[1] = uVar4 & uVar1;
  puVar7[2] = uVar5 & uVar2;
  puVar7[3] = uVar6 & uVar3;
  return puVar7;
}

Assistant:

void* BitSetImplement<Bitset, Base>::setIntersection(void *A, void *B) {
	Bitset *__A__ = (Bitset*) A, *__B__ = (Bitset*) B, *__C__ = new Bitset();
	*__C__ = (*__A__) & (*__B__);
	return __C__;
}